

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O1

type cm::operator==(StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *l,char (*r) [4])

{
  int iVar1;
  type tVar2;
  string local_40;
  
  StringOpPlus::operator_cast_to_string(&local_40,(StringOpPlus *)l);
  if (local_40._M_string_length == 3) {
    iVar1 = bcmp(local_40._M_dataplus._M_p,r,3);
    tVar2 = iVar1 == 0;
  }
  else {
    tVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return tVar2;
}

Assistant:

typename std::enable_if<AsStringView<R>::value, bool>::type operator==(
  StringOpPlus<LL, LR> const& l, R&& r)
{
  return std::string(l) == AsStringView<R>::view(std::forward<R>(r));
}